

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

carrier_uint
fmt::v7::detail::dragonbox::cache_accessor<double>::compute_left_endpoint_for_shorter_interval_case
          (cache_entry_type *cache,int beta_minus_1)

{
  uint64_t uVar1;
  uint64_t uVar2;
  int beta_minus_1_local;
  cache_entry_type *cache_local;
  
  uVar1 = uint128_wrapper::high(cache);
  uVar2 = uint128_wrapper::high(cache);
  return uVar1 - (uVar2 >> 0x36) >> (0xbU - (char)beta_minus_1 & 0x3f);
}

Assistant:

static carrier_uint compute_left_endpoint_for_shorter_interval_case(
      const cache_entry_type& cache, int beta_minus_1) FMT_NOEXCEPT {
    return (cache.high() -
            (cache.high() >> (float_info<double>::significand_bits + 2))) >>
           (64 - float_info<double>::significand_bits - 1 - beta_minus_1);
  }